

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools.cpp
# Opt level: O0

int Help(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  AbstractTool *pAVar3;
  ostream *poVar4;
  long in_RSI;
  int in_EDI;
  int result;
  AbstractTool *tool;
  allocator local_39;
  string local_38 [32];
  AbstractTool *local_18;
  undefined4 in_stack_fffffffffffffffc;
  
  if (2 < in_EDI) {
    pcVar1 = *(char **)(in_RSI + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    pAVar3 = CreateTool((string *)CONCAT44(in_stack_fffffffffffffffc,in_EDI));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (pAVar3 != (AbstractTool *)0x0) {
      local_18 = pAVar3;
      iVar2 = (*pAVar3->_vptr_AbstractTool[2])();
      if (local_18 == (AbstractTool *)0x0) {
        return iVar2;
      }
      (*local_18->_vptr_AbstractTool[1])();
      return iVar2;
    }
    local_18 = (AbstractTool *)0x0;
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,"usage: bamtools [--help] COMMAND [ARGS]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,"Available bamtools commands:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\tconvert         Converts between BAM and a number of other formats");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\tcount           Prints number of alignments in BAM file(s)");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\tcoverage        Prints coverage statistics from the input BAM file");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\tfilter          Filters BAM file(s) by user-specified criteria");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,"\theader          Prints BAM header information");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,"\tindex           Generates index for BAM file");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\tmerge           Merge multiple BAM files into single file");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\trandom          Select random alignments from existing BAM file(s), intended more as a testing tool."
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\tresolve         Resolves paired-end reads (marking the IsProperPair flag as needed)"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\trevert          Removes duplicate marks and restores original base qualities"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\tsort            Sorts the BAM file according to some criteria");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\tsplit           Splits a BAM file on user-specified property, creating a new BAM output file for each value found"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\tstats           Prints some basic statistics from input BAM file(s)");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "See \'bamtools help COMMAND\' for more information on a specific command."
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int Help(int argc, char* argv[])
{

    // check for 'bamtools help COMMAND' to print tool-specific help message
    if (argc > 2) {

        // determine desired sub-tool
        AbstractTool* tool = CreateTool(argv[2]);

        // if tool known, print its help screen
        if (tool) {
            const int result = tool->Help();
            delete tool;
            return result;
        }
    }

    // print general BamTools help message
    std::cerr << std::endl;
    std::cerr << "usage: bamtools [--help] COMMAND [ARGS]" << std::endl;
    std::cerr << std::endl;
    std::cerr << "Available bamtools commands:" << std::endl;
    std::cerr << "\tconvert         Converts between BAM and a number of other formats"
              << std::endl;
    std::cerr << "\tcount           Prints number of alignments in BAM file(s)" << std::endl;
    std::cerr << "\tcoverage        Prints coverage statistics from the input BAM file"
              << std::endl;
    std::cerr << "\tfilter          Filters BAM file(s) by user-specified criteria" << std::endl;
    std::cerr << "\theader          Prints BAM header information" << std::endl;
    std::cerr << "\tindex           Generates index for BAM file" << std::endl;
    std::cerr << "\tmerge           Merge multiple BAM files into single file" << std::endl;
    std::cerr << "\trandom          Select random alignments from existing BAM file(s), intended "
                 "more as a testing tool."
              << std::endl;
    std::cerr
        << "\tresolve         Resolves paired-end reads (marking the IsProperPair flag as needed)"
        << std::endl;
    std::cerr << "\trevert          Removes duplicate marks and restores original base qualities"
              << std::endl;
    std::cerr << "\tsort            Sorts the BAM file according to some criteria" << std::endl;
    std::cerr << "\tsplit           Splits a BAM file on user-specified property, creating a new "
                 "BAM output file for each value found"
              << std::endl;
    std::cerr << "\tstats           Prints some basic statistics from input BAM file(s)"
              << std::endl;
    std::cerr << std::endl;
    std::cerr << "See 'bamtools help COMMAND' for more information on a specific command."
              << std::endl;
    std::cerr << std::endl;
    return EXIT_SUCCESS;
}